

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared_statement.cpp
# Opt level: O2

void __thiscall
duckdb::PreparedStatement::PreparedStatement(PreparedStatement *this,ErrorData *error)

{
  (this->data).internal.
  super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->data).internal.
  super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->query)._M_dataplus._M_p = (pointer)&(this->query).field_2;
  (this->query)._M_string_length = 0;
  (this->query).field_2._M_local_buf[0] = '\0';
  this->success = false;
  ErrorData::ErrorData(&this->error,error);
  (this->named_param_map)._M_h._M_buckets = &(this->named_param_map)._M_h._M_single_bucket;
  (this->named_param_map)._M_h._M_bucket_count = 1;
  (this->named_param_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->named_param_map)._M_h._M_element_count = 0;
  (this->named_param_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->named_param_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->named_param_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

PreparedStatement::PreparedStatement(ErrorData error) : context(nullptr), success(false), error(std::move(error)) {
}